

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::InstanceISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,InstanceISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  unsigned_long *puVar1;
  float geom_time_segments;
  undefined8 uVar2;
  BBox1f BVar3;
  long lVar4;
  PrimRefMB *pPVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  float fVar11;
  uint uVar12;
  ulong uVar13;
  AffineSpace3ff *pAVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar23;
  float fVar24;
  undefined1 auVar21 [16];
  float fVar25;
  undefined1 auVar22 [16];
  float fVar26;
  float fVar30;
  float fVar31;
  undefined1 auVar27 [16];
  float fVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar33;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [16];
  float fVar55;
  float fVar57;
  float fVar58;
  undefined1 auVar56 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  LBBox3fa lbbox;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  uVar2 = vmovlps_avx(auVar16);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar2;
  (__return_storage_ptr__->time_range).upper = 0.0;
  BVar3 = (this->super_Instance).super_Geometry.time_range;
  auVar19._8_8_ = 0;
  auVar19._0_4_ = BVar3.lower;
  auVar19._4_4_ = BVar3.upper;
  geom_time_segments = (this->super_Instance).super_Geometry.fnumTimeSegments;
  fVar18 = BVar3.lower;
  auVar16 = vmovshdup_avx(auVar19);
  fVar11 = auVar16._0_4_ - fVar18;
  auVar16 = ZEXT416((uint)(geom_time_segments * ((t0t1->lower - fVar18) / fVar11) * 1.0000002));
  auVar16 = vroundss_avx(auVar16,auVar16,9);
  auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,auVar16);
  auVar19 = ZEXT416((uint)(geom_time_segments * ((t0t1->upper - fVar18) / fVar11) * 0.99999976));
  auVar19 = vroundss_avx(auVar19,auVar19,10);
  auVar19 = vminss_avx(auVar19,ZEXT416((uint)geom_time_segments));
  uVar13 = (ulong)(int)auVar16._0_4_;
  lVar4 = *(long *)&(this->super_Instance).super_Geometry.field_0x58;
  pAVar14 = (this->super_Instance).local2world + uVar13;
  auVar48._8_4_ = 0x5dccb9a2;
  auVar48._0_8_ = 0x5dccb9a25dccb9a2;
  auVar48._12_4_ = 0x5dccb9a2;
  do {
    if ((ulong)(long)(int)auVar19._0_4_ < uVar13) {
      Instance::nonlinearBounds
                ((LBBox3fa *)&local_78.field_1,&this->super_Instance,t0t1,
                 &(this->super_Instance).super_Geometry.time_range,geom_time_segments);
      uVar12 = (this->super_Instance).super_Geometry.numTimeSteps - 1;
      BVar3 = (this->super_Instance).super_Geometry.time_range;
      auVar17._8_8_ = 0;
      auVar17._0_4_ = BVar3.lower;
      auVar17._4_4_ = BVar3.upper;
      aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx((undefined1  [16])local_78,ZEXT416(geomID),0x30);
      aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vblendps_avx(ZEXT816(0) << 0x40,local_68,7);
      aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(local_58,ZEXT416(uVar12),0x30);
      aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(local_48,ZEXT416(uVar12),0x30);
      auVar41._0_4_ = aVar7.x * 0.5 + aVar8.x * 0.5 + aVar9.x * 0.5 + aVar6.x * 0.5;
      auVar41._4_4_ = aVar7.y * 0.5 + aVar8.y * 0.5 + aVar9.y * 0.5 + aVar6.y * 0.5;
      auVar41._8_4_ = aVar7.z * 0.5 + aVar8.z * 0.5 + aVar9.z * 0.5 + aVar6.z * 0.5;
      auVar41._12_4_ =
           aVar7.field_3.w * 0.5 + aVar8.field_3.w * 0.5 +
           aVar9.field_3.w * 0.5 + aVar6.field_3.w * 0.5;
      auVar47._8_4_ = 0x7f800000;
      auVar47._0_8_ = 0x7f8000007f800000;
      auVar47._12_4_ = 0x7f800000;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar47,(undefined1  [16])aVar7);
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = aVar10;
      auVar49._8_4_ = 0xff800000;
      auVar49._0_8_ = 0xff800000ff800000;
      auVar49._12_4_ = 0xff800000;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar49,(undefined1  [16])aVar6);
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = aVar10;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar47,(undefined1  [16])aVar8);
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = aVar10;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar49,(undefined1  [16])aVar9);
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = aVar10;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar47,auVar41);
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = aVar10;
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar49,auVar41);
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = aVar10;
      auVar16 = vcmpps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17,1);
      auVar19 = vinsertps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17,0x5c);
      auVar35._4_12_ = ZEXT812(0) << 0x20;
      auVar35._0_4_ = BVar3.lower;
      auVar16 = vblendvps_avx(auVar35,auVar19,auVar16);
      BVar3 = (BBox1f)vmovlps_avx(auVar16);
      __return_storage_ptr__->time_range = BVar3;
      puVar1 = &(__return_storage_ptr__->object_range)._end;
      *puVar1 = *puVar1 + 1;
      __return_storage_ptr__->num_time_segments = (ulong)uVar12;
      if (uVar12 != 0) {
        __return_storage_ptr__->max_num_time_segments = (ulong)uVar12;
        BVar3 = (BBox1f)vmovlps_avx(auVar17);
        __return_storage_ptr__->max_time_range = BVar3;
      }
      pPVar5 = prims->items;
      pPVar5[k].lbounds.bounds0.lower.field_0.field_1 = aVar7;
      pPVar5[k].lbounds.bounds0.upper.field_0.field_1 = aVar6;
      pPVar5[k].lbounds.bounds1.lower.field_0.field_1 = aVar8;
      pPVar5[k].lbounds.bounds1.upper.field_0.field_1 = aVar9;
      BVar3 = (BBox1f)vmovlps_avx(auVar17);
      pPVar5[k].time_range = BVar3;
      return __return_storage_ptr__;
    }
    if ((this->super_Instance).super_Geometry.field_8.field_0x1 == '\x01') {
      fVar45 = (pAVar14->p).field_0.m128[3];
      fVar20 = (pAVar14->l).vx.field_0.m128[3];
      fVar23 = (pAVar14->l).vy.field_0.m128[3];
      fVar26 = (pAVar14->l).vz.field_0.m128[3];
      fVar30 = fVar20 * fVar23 + fVar26 * fVar45;
      fVar50 = fVar20 * fVar23 - fVar26 * fVar45;
      fVar52 = fVar45 * fVar45 - fVar20 * fVar20;
      fVar53 = fVar20 * fVar26 - fVar23 * fVar45;
      fVar31 = fVar20 * fVar26 + fVar23 * fVar45;
      fVar32 = fVar23 * fVar26 + fVar20 * fVar45;
      fVar54 = fVar23 * fVar26 - fVar20 * fVar45;
      auVar16 = ZEXT416((uint)(fVar30 + fVar30));
      auVar16 = vshufps_avx(auVar16,auVar16,0);
      auVar17 = ZEXT416((uint)(fVar53 + fVar53));
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      auVar35 = vpermilps_avx(ZEXT416((uint)(fVar20 * fVar20 + fVar45 * fVar45 + -fVar23 * fVar23 +
                                            -fVar26 * fVar26)),0);
      fVar42 = auVar35._0_4_ * 1.0 + auVar17._0_4_ * 0.0 + auVar16._0_4_ * 0.0;
      fVar43 = auVar35._4_4_ * 0.0 + auVar17._4_4_ * 0.0 + auVar16._4_4_ * 1.0;
      fVar44 = auVar35._8_4_ * 0.0 + auVar17._8_4_ * 1.0 + auVar16._8_4_ * 0.0;
      fVar24 = auVar35._12_4_ * 0.0 + auVar17._12_4_ * 0.0 + auVar16._12_4_ * 0.0;
      auVar16 = ZEXT416((uint)(fVar50 + fVar50));
      auVar16 = vshufps_avx(auVar16,auVar16,0);
      auVar17 = ZEXT416((uint)(fVar23 * fVar23 + fVar52 + -fVar26 * fVar26));
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      auVar35 = ZEXT416((uint)(fVar32 + fVar32));
      auVar35 = vshufps_avx(auVar35,auVar35,0);
      fVar25 = auVar16._0_4_ * 1.0 + auVar17._0_4_ * 0.0 + auVar35._0_4_ * 0.0;
      fVar33 = auVar16._4_4_ * 0.0 + auVar17._4_4_ * 1.0 + auVar35._4_4_ * 0.0;
      fVar36 = auVar16._8_4_ * 0.0 + auVar17._8_4_ * 0.0 + auVar35._8_4_ * 1.0;
      fVar37 = auVar16._12_4_ * 0.0 + auVar17._12_4_ * 0.0 + auVar35._12_4_ * 0.0;
      auVar16 = ZEXT416((uint)(fVar31 + fVar31));
      auVar16 = vshufps_avx(auVar16,auVar16,0);
      auVar17 = ZEXT416((uint)(fVar54 + fVar54));
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      auVar35 = vpermilps_avx(ZEXT416((uint)(fVar26 * fVar26 + -fVar23 * fVar23 + fVar52)),0);
      fVar38 = auVar16._0_4_ * 1.0 + auVar17._0_4_ * 0.0 + auVar35._0_4_ * 0.0;
      fVar64 = auVar16._4_4_ * 0.0 + auVar17._4_4_ * 1.0 + auVar35._4_4_ * 0.0;
      fVar67 = auVar16._8_4_ * 0.0 + auVar17._8_4_ * 0.0 + auVar35._8_4_ * 1.0;
      fVar68 = auVar16._12_4_ * 0.0 + auVar17._12_4_ * 0.0 + auVar35._12_4_ * 0.0;
      fVar45 = (pAVar14->l).vx.field_0.m128[0];
      fVar26 = fVar45 * fVar42 + fVar25 * 0.0 + fVar38 * 0.0;
      fVar30 = fVar45 * fVar43 + fVar33 * 0.0 + fVar64 * 0.0;
      fVar31 = fVar45 * fVar44 + fVar36 * 0.0 + fVar67 * 0.0;
      fVar32 = fVar45 * fVar24 + fVar37 * 0.0 + fVar68 * 0.0;
      fVar45 = (pAVar14->l).vy.field_0.m128[0];
      fVar20 = (pAVar14->l).vy.field_0.m128[1];
      fVar50 = fVar45 * fVar42 + fVar20 * fVar25 + fVar38 * 0.0;
      fVar52 = fVar45 * fVar43 + fVar20 * fVar33 + fVar64 * 0.0;
      fVar53 = fVar45 * fVar44 + fVar20 * fVar36 + fVar67 * 0.0;
      fVar54 = fVar45 * fVar24 + fVar20 * fVar37 + fVar68 * 0.0;
      fVar45 = (pAVar14->l).vz.field_0.m128[1];
      fVar20 = (pAVar14->l).vz.field_0.m128[2];
      fVar23 = (pAVar14->l).vz.field_0.m128[0];
      fVar55 = fVar23 * fVar42 + fVar45 * fVar25 + fVar20 * fVar38;
      fVar57 = fVar23 * fVar43 + fVar45 * fVar33 + fVar20 * fVar64;
      fVar58 = fVar23 * fVar44 + fVar45 * fVar36 + fVar20 * fVar67;
      fVar59 = fVar23 * fVar24 + fVar45 * fVar37 + fVar20 * fVar68;
      fVar45 = (pAVar14->p).field_0.m128[2];
      fVar20 = (pAVar14->p).field_0.m128[1];
      fVar23 = (pAVar14->p).field_0.m128[0];
      auVar16 = vshufps_avx((undefined1  [16])(pAVar14->l).vx.field_0,ZEXT816(0),0xe9);
      auVar16 = vblendps_avx(auVar16,(undefined1  [16])(pAVar14->l).vy.field_0,4);
      fVar42 = auVar16._0_4_ + 0.0 + fVar23 * fVar42 + fVar20 * fVar25 + fVar45 * fVar38;
      fVar43 = auVar16._4_4_ + 0.0 + fVar23 * fVar43 + fVar20 * fVar33 + fVar45 * fVar64;
      fVar44 = auVar16._8_4_ + 0.0 + fVar23 * fVar44 + fVar20 * fVar36 + fVar45 * fVar67;
      fVar45 = auVar16._12_4_ + 0.0 + fVar23 * fVar24 + fVar20 * fVar37 + fVar45 * fVar68;
    }
    else {
      fVar26 = (pAVar14->l).vx.field_0.m128[0];
      fVar30 = (pAVar14->l).vx.field_0.m128[1];
      fVar31 = (pAVar14->l).vx.field_0.m128[2];
      fVar32 = (pAVar14->l).vx.field_0.m128[3];
      fVar50 = (pAVar14->l).vy.field_0.m128[0];
      fVar52 = (pAVar14->l).vy.field_0.m128[1];
      fVar53 = (pAVar14->l).vy.field_0.m128[2];
      fVar54 = (pAVar14->l).vy.field_0.m128[3];
      fVar55 = (pAVar14->l).vz.field_0.m128[0];
      fVar57 = (pAVar14->l).vz.field_0.m128[1];
      fVar58 = (pAVar14->l).vz.field_0.m128[2];
      fVar59 = (pAVar14->l).vz.field_0.m128[3];
      fVar42 = (pAVar14->p).field_0.m128[0];
      fVar43 = (pAVar14->p).field_0.m128[1];
      fVar44 = (pAVar14->p).field_0.m128[2];
      fVar45 = (pAVar14->p).field_0.m128[3];
    }
    fVar20 = ((float)(int)uVar13 * fVar11) / geom_time_segments + fVar18;
    auVar16 = vshufps_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),0);
    auVar17 = vshufps_avx(ZEXT416((uint)(1.0 - fVar20)),ZEXT416((uint)(1.0 - fVar20)),0);
    auVar21._0_4_ =
         auVar16._0_4_ * *(float *)(lVar4 + 0x30) + auVar17._0_4_ * *(float *)(lVar4 + 0x10);
    auVar21._4_4_ =
         auVar16._4_4_ * *(float *)(lVar4 + 0x34) + auVar17._4_4_ * *(float *)(lVar4 + 0x14);
    auVar21._8_4_ =
         auVar16._8_4_ * *(float *)(lVar4 + 0x38) + auVar17._8_4_ * *(float *)(lVar4 + 0x18);
    auVar21._12_4_ =
         auVar16._12_4_ * *(float *)(lVar4 + 0x3c) + auVar17._12_4_ * *(float *)(lVar4 + 0x1c);
    auVar27._0_4_ =
         auVar16._0_4_ * *(float *)(lVar4 + 0x40) + auVar17._0_4_ * *(float *)(lVar4 + 0x20);
    auVar27._4_4_ =
         auVar16._4_4_ * *(float *)(lVar4 + 0x44) + auVar17._4_4_ * *(float *)(lVar4 + 0x24);
    auVar27._8_4_ =
         auVar16._8_4_ * *(float *)(lVar4 + 0x48) + auVar17._8_4_ * *(float *)(lVar4 + 0x28);
    auVar27._12_4_ =
         auVar16._12_4_ * *(float *)(lVar4 + 0x4c) + auVar17._12_4_ * *(float *)(lVar4 + 0x2c);
    auVar16 = vshufps_avx(auVar21,auVar21,0);
    auVar17 = vshufps_avx(auVar21,auVar21,0x55);
    auVar35 = vshufps_avx(auVar21,auVar21,0xaa);
    fVar20 = fVar42 + fVar55 * auVar35._0_4_;
    fVar23 = fVar43 + fVar57 * auVar35._4_4_;
    fVar24 = fVar44 + fVar58 * auVar35._8_4_;
    fVar25 = fVar45 + fVar59 * auVar35._12_4_;
    fVar64 = fVar50 * auVar17._0_4_;
    fVar67 = fVar52 * auVar17._4_4_;
    fVar68 = fVar53 * auVar17._8_4_;
    fVar69 = fVar54 * auVar17._12_4_;
    fVar33 = fVar64 + fVar20;
    fVar36 = fVar67 + fVar23;
    fVar37 = fVar68 + fVar24;
    fVar38 = fVar69 + fVar25;
    fVar60 = fVar26 * auVar16._0_4_;
    fVar61 = fVar30 * auVar16._4_4_;
    fVar62 = fVar31 * auVar16._8_4_;
    fVar63 = fVar32 * auVar16._12_4_;
    auVar39._0_4_ = fVar60 + fVar33;
    auVar39._4_4_ = fVar61 + fVar36;
    auVar39._8_4_ = fVar62 + fVar37;
    auVar39._12_4_ = fVar63 + fVar38;
    auVar35 = vshufps_avx(auVar27,auVar27,0xaa);
    auVar56._8_4_ = 0x7f800000;
    auVar56._0_8_ = 0x7f8000007f800000;
    auVar56._12_4_ = 0x7f800000;
    auVar17 = vminps_avx(auVar56,auVar39);
    auVar46._8_4_ = 0xff800000;
    auVar46._0_8_ = 0xff800000ff800000;
    auVar46._12_4_ = 0xff800000;
    auVar16 = vmaxps_avx(auVar46,auVar39);
    fVar42 = fVar42 + fVar55 * auVar35._0_4_;
    fVar43 = fVar43 + fVar57 * auVar35._4_4_;
    fVar44 = fVar44 + fVar58 * auVar35._8_4_;
    fVar45 = fVar45 + fVar59 * auVar35._12_4_;
    fVar64 = fVar64 + fVar42;
    fVar67 = fVar67 + fVar43;
    fVar68 = fVar68 + fVar44;
    fVar69 = fVar69 + fVar45;
    auVar65._0_4_ = fVar60 + fVar64;
    auVar65._4_4_ = fVar61 + fVar67;
    auVar65._8_4_ = fVar62 + fVar68;
    auVar65._12_4_ = fVar63 + fVar69;
    auVar17 = vminps_avx(auVar17,auVar65);
    auVar16 = vmaxps_avx(auVar16,auVar65);
    auVar35 = vshufps_avx(auVar27,auVar27,0x55);
    fVar50 = fVar50 * auVar35._0_4_;
    fVar52 = fVar52 * auVar35._4_4_;
    fVar53 = fVar53 * auVar35._8_4_;
    fVar54 = fVar54 * auVar35._12_4_;
    fVar20 = fVar50 + fVar20;
    fVar23 = fVar52 + fVar23;
    fVar24 = fVar53 + fVar24;
    fVar25 = fVar54 + fVar25;
    auVar66._0_4_ = fVar60 + fVar20;
    auVar66._4_4_ = fVar61 + fVar23;
    auVar66._8_4_ = fVar62 + fVar24;
    auVar66._12_4_ = fVar63 + fVar25;
    auVar17 = vminps_avx(auVar17,auVar66);
    auVar16 = vmaxps_avx(auVar16,auVar66);
    fVar50 = fVar50 + fVar42;
    fVar52 = fVar52 + fVar43;
    fVar53 = fVar53 + fVar44;
    fVar54 = fVar54 + fVar45;
    auVar51._0_4_ = fVar60 + fVar50;
    auVar51._4_4_ = fVar61 + fVar52;
    auVar51._8_4_ = fVar62 + fVar53;
    auVar51._12_4_ = fVar63 + fVar54;
    auVar17 = vminps_avx(auVar17,auVar51);
    auVar16 = vmaxps_avx(auVar16,auVar51);
    auVar35 = vshufps_avx(auVar27,auVar27,0);
    fVar26 = fVar26 * auVar35._0_4_;
    fVar30 = fVar30 * auVar35._4_4_;
    fVar31 = fVar31 * auVar35._8_4_;
    fVar32 = fVar32 * auVar35._12_4_;
    auVar34._0_4_ = fVar26 + fVar33;
    auVar34._4_4_ = fVar30 + fVar36;
    auVar34._8_4_ = fVar31 + fVar37;
    auVar34._12_4_ = fVar32 + fVar38;
    auVar17 = vminps_avx(auVar17,auVar34);
    auVar16 = vmaxps_avx(auVar16,auVar34);
    auVar40._0_4_ = fVar64 + fVar26;
    auVar40._4_4_ = fVar67 + fVar30;
    auVar40._8_4_ = fVar68 + fVar31;
    auVar40._12_4_ = fVar69 + fVar32;
    auVar17 = vminps_avx(auVar17,auVar40);
    auVar16 = vmaxps_avx(auVar16,auVar40);
    auVar22._0_4_ = fVar26 + fVar20;
    auVar22._4_4_ = fVar30 + fVar23;
    auVar22._8_4_ = fVar31 + fVar24;
    auVar22._12_4_ = fVar32 + fVar25;
    auVar17 = vminps_avx(auVar17,auVar22);
    auVar16 = vmaxps_avx(auVar16,auVar22);
    auVar28._0_4_ = fVar26 + fVar50;
    auVar28._4_4_ = fVar30 + fVar52;
    auVar28._8_4_ = fVar31 + fVar53;
    auVar28._12_4_ = fVar32 + fVar54;
    auVar35 = vminps_avx(auVar17,auVar28);
    auVar17 = vmaxps_avx(auVar16,auVar28);
    auVar29._8_4_ = 0xddccb9a2;
    auVar29._0_8_ = 0xddccb9a2ddccb9a2;
    auVar29._12_4_ = 0xddccb9a2;
    auVar16 = vcmpps_avx(auVar35,auVar29,6);
    auVar17 = vcmpps_avx(auVar17,auVar48,1);
    auVar16 = vandps_avx(auVar17,auVar16);
    uVar15 = vmovmskps_avx(auVar16);
    uVar13 = uVar13 + 1;
    pAVar14 = pAVar14 + 1;
  } while ((~(byte)uVar15 & 7) == 0);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        assert(r.begin() == 0);
        assert(r.end()   == 1);

        PrimInfoMB pinfo(empty);
        if (!valid(0, timeSegmentRange(t0t1))) return pinfo;
        const PrimRefMB prim(linearBounds(0,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(0));
        pinfo.add_primref(prim);
        prims[k++] = prim;
        return pinfo;
      }